

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::test_case_end
          (ConsoleReporter *this,CurrentTestCaseStats *st)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  ostream *poVar4;
  char *pcVar5;
  
  if (this->tc->m_no_output != false) {
    return;
  }
  if ((this->opt->duration != false) || (bVar2 = 0, 1 < (uint)st->failure_flags)) {
    logTestStart(this);
    bVar2 = this->opt->duration;
  }
  if ((bVar2 & 1) != 0) {
    poVar4 = this->s;
    Color::operator<<(poVar4,None);
    lVar1 = *(long *)poVar4;
    *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 8) = 6;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xfffffefb | 4;
    poVar4 = std::ostream::_M_insert<double>(st->seconds);
    poVar4 = std::operator<<(poVar4," s: ");
    poVar4 = std::operator<<(poVar4,this->tc->m_name);
    std::operator<<(poVar4,"\n");
  }
  uVar3 = st->failure_flags;
  if ((uVar3 & 0x10) != 0) {
    poVar4 = this->s;
    Color::operator<<(poVar4,Red);
    poVar4 = std::operator<<(poVar4,"Test case exceeded time limit of ");
    lVar1 = *(long *)poVar4;
    *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 8) = 6;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xfffffefb | 4;
    poVar4 = std::ostream::_M_insert<double>(this->tc->m_timeout);
    std::operator<<(poVar4,"!\n");
    uVar3 = st->failure_flags;
  }
  if ((uVar3 & 0x20) == 0) {
    if ((uVar3 & 0x40) == 0) {
      if ((uVar3 >> 9 & 1) == 0) {
        if ((char)uVar3 < '\0') {
          poVar4 = this->s;
          Color::operator<<(poVar4,Red);
          poVar4 = std::operator<<(poVar4,"Didn\'t fail exactly ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->tc->m_expected_failures);
          pcVar5 = " times so marking it as failed!\n";
        }
        else {
          if ((uVar3 >> 8 & 1) == 0) goto LAB_0010ffe4;
          poVar4 = this->s;
          Color::operator<<(poVar4,Yellow);
          poVar4 = std::operator<<(poVar4,"Failed exactly ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->tc->m_expected_failures);
          pcVar5 = " times as expected so marking it as not failed!\n";
        }
      }
      else {
        poVar4 = this->s;
        Color::operator<<(poVar4,Yellow);
        pcVar5 = "Allowed to fail so marking it as not failed\n";
      }
    }
    else {
      poVar4 = this->s;
      Color::operator<<(poVar4,Yellow);
      pcVar5 = "Failed as expected so marking it as not failed\n";
    }
  }
  else {
    poVar4 = this->s;
    Color::operator<<(poVar4,Red);
    pcVar5 = "Should have failed but didn\'t! Marking it as failed!\n";
  }
  std::operator<<(poVar4,pcVar5);
LAB_0010ffe4:
  if ((st->failure_flags & 8) != 0) {
    poVar4 = this->s;
    Color::operator<<(poVar4,Red);
    std::operator<<(poVar4,"Aborting - too many failed asserts!\n");
  }
  Color::operator<<(this->s,None);
  return;
}

Assistant:

void test_case_end(const CurrentTestCaseStats& st) override {
            if(tc->m_no_output)
                return;

            // log the preamble of the test case only if there is something
            // else to print - something other than that an assert has failed
            if(opt.duration ||
               (st.failure_flags && st.failure_flags != TestCaseFailureReason::AssertFailure))
                logTestStart();

            if(opt.duration)
                s << Color::None << std::setprecision(6) << std::fixed << st.seconds
                  << " s: " << tc->m_name << "\n";

            if(st.failure_flags & TestCaseFailureReason::Timeout)
                s << Color::Red << "Test case exceeded time limit of " << std::setprecision(6)
                  << std::fixed << tc->m_timeout << "!\n";

            if(st.failure_flags & TestCaseFailureReason::ShouldHaveFailedButDidnt) {
                s << Color::Red << "Should have failed but didn't! Marking it as failed!\n";
            } else if(st.failure_flags & TestCaseFailureReason::ShouldHaveFailedAndDid) {
                s << Color::Yellow << "Failed as expected so marking it as not failed\n";
            } else if(st.failure_flags & TestCaseFailureReason::CouldHaveFailedAndDid) {
                s << Color::Yellow << "Allowed to fail so marking it as not failed\n";
            } else if(st.failure_flags & TestCaseFailureReason::DidntFailExactlyNumTimes) {
                s << Color::Red << "Didn't fail exactly " << tc->m_expected_failures
                  << " times so marking it as failed!\n";
            } else if(st.failure_flags & TestCaseFailureReason::FailedExactlyNumTimes) {
                s << Color::Yellow << "Failed exactly " << tc->m_expected_failures
                  << " times as expected so marking it as not failed!\n";
            }
            if(st.failure_flags & TestCaseFailureReason::TooManyFailedAsserts) {
                s << Color::Red << "Aborting - too many failed asserts!\n";
            }
            s << Color::None; // lgtm [cpp/useless-expression]
        }